

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

int check_response_cache(CManager_conflict cm,stone_type stone,action_class stage,event_item *event)

{
  int iVar1;
  FFSTypeHandle p_Var2;
  long lVar3;
  undefined4 in_register_00000014;
  int iVar4;
  CMincoming_format_list p_Var5;
  
  iVar4 = (int)stone;
  if (0 < (long)cm->in_format_count) {
    p_Var5 = cm->in_formats;
    p_Var2 = *(FFSTypeHandle *)(CONCAT44(in_register_00000014,stage) + 0x30);
    lVar3 = 0;
    do {
      if (p_Var5->format == p_Var2) {
        iVar1 = *(int *)((long)&p_Var5->handler + 4);
        if (iVar1 == 0) {
          if (*(int *)&p_Var5->handler == iVar4) {
            if (*(int *)(CONCAT44(in_register_00000014,stage) + 4) == 0) goto LAB_0013365f;
            goto LAB_0013364b;
          }
        }
        else if ((*(int *)&p_Var5->handler == iVar4) ||
                (iVar4 == 1 && *(int *)&p_Var5->handler == 0)) {
          if (*(int *)(CONCAT44(in_register_00000014,stage) + 4) != 0) goto LAB_0013364b;
          if ((iVar1 != 7) || ((FFSTypeHandle)p_Var5->local_prior_format != p_Var2))
          goto LAB_0013365f;
        }
      }
      else if (p_Var5->format == (FFSTypeHandle)0x0) {
LAB_0013364b:
        if (*(int *)((long)&p_Var5->client_data + 4) == 0) {
LAB_0013365f:
          return (int)lVar3;
        }
      }
      lVar3 = lVar3 + 1;
      p_Var5 = (CMincoming_format_list)&p_Var5->f2_format;
    } while (cm->in_format_count != lVar3);
  }
  return -1;
}

Assistant:

static int
check_response_cache(CManager cm, stone_type stone, action_class stage, event_item *event)
{
    int i;
    for (i=0; i < stone->response_cache_count; i++) {
//	CMtrace_out(cm, EVerbose, "Response cache %d reference_format is %p (%s), Type %s, stage is %d, requires_decoded is %d\n", i, 
//		    stone->response_cache[i].reference_format, 
//		    global_name_of_FMFormat(stone->response_cache[i].reference_format), action_str[stone->response_cache[i].action_type],
//		    stone->response_cache[i].stage, stone->response_cache[i].requires_decoded);
	if (stone->response_cache[i].reference_format == event->reference_format) {
	    /* 
	     * if the event is encoded and the action requires decoded data,
	     * this action won't do.  Scan further for decode action or 
	     * generate one with response_determination().
	     */
	    if ((stone->response_cache[i].action_type == Action_NoAction) &&
		(stage != stone->response_cache[i].stage)) {
		/* don't return NoAction unless we're querying this exact stage */
		continue;
	    }
	    if (!compatible_stages(stage, stone->response_cache[i].stage)) {
		continue;
	    }
	    if (event->event_encoded && stone->response_cache[i].requires_decoded) {
		continue;
	    }
	    if (!event->event_encoded &&
	    	(stone->response_cache[i].action_type == Action_Decode) &&
	    	(stone->response_cache[i].o.decode.target_reference_format == event->reference_format)) {
	    	continue;
	    }
	    return i;
	} else if (stone->response_cache[i].reference_format == NULL &&
                   !stone->response_cache[i].requires_decoded) {
            return i;
        }
    }
    return -1;
}